

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ea_dominator_tree.cpp
# Opt level: O2

void __thiscall ee_dataflow::compute_dominator_tree(ee_dataflow *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *this_01;
  pointer pvVar1;
  int *piVar2;
  pointer piVar3;
  ee_dataflow *peVar4;
  int iVar5;
  int iVar6;
  int i_1;
  int i;
  long lVar7;
  int *piVar8;
  ulong uVar9;
  int w;
  int ndfn;
  ee_dataflow *local_140;
  vector<int,_std::allocator<int>_> semi;
  vector<int,_std::allocator<int>_> dfn;
  vector<int,_std::allocator<int>_> fa;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  dom;
  vector<int,_std::allocator<int>_> inset;
  vector<int,_std::allocator<int>_> seq;
  anon_class_40_5_7c25027c dfs_dfn;
  anon_class_32_4_a787555a find;
  vector<int,_std::allocator<int>_> upset_minsemi;
  anon_class_24_3_b8082bb5 eval;
  
  ndfn = 0;
  dfs_dfn.dfn = (vector<int,_std::allocator<int>_> *)CONCAT44(dfs_dfn.dfn._4_4_,0xffffffff);
  std::vector<int,_std::allocator<int>_>::vector
            (&dfn,(long)this->n_exprs,(value_type_conflict2 *)&dfs_dfn,(allocator_type *)&find);
  std::vector<int,_std::allocator<int>_>::vector
            (&seq,(long)this->n_exprs,(allocator_type *)&dfs_dfn);
  std::vector<int,_std::allocator<int>_>::vector
            (&semi,(long)this->n_exprs,(allocator_type *)&dfs_dfn);
  std::vector<int,_std::allocator<int>_>::vector(&fa,(long)this->n_exprs,(allocator_type *)&dfs_dfn)
  ;
  std::vector<int,_std::allocator<int>_>::vector
            (&inset,(long)this->n_exprs,(allocator_type *)&dfs_dfn);
  std::vector<int,_std::allocator<int>_>::vector
            (&upset_minsemi,(long)this->n_exprs,(allocator_type *)&dfs_dfn);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&dom,(long)this->n_exprs,(allocator_type *)&dfs_dfn);
  this_00 = &this->idom;
  std::vector<int,_std::allocator<int>_>::resize(this_00,(long)this->n_exprs);
  dfs_dfn.dfn = &dfn;
  dfs_dfn.ndfn = &ndfn;
  *fa.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start = -1;
  local_140 = this;
  dfs_dfn.seq = &seq;
  dfs_dfn.this = this;
  dfs_dfn.fa = &fa;
  compute_dominator_tree()::$_0::operator()(&dfs_dfn,0,&dfs_dfn);
  for (lVar7 = 0; lVar7 < local_140->n_exprs; lVar7 = lVar7 + 1) {
    iVar5 = (int)lVar7;
    semi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [lVar7] = iVar5;
    inset.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [lVar7] = iVar5;
    upset_minsemi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar7] = iVar5;
  }
  find.dfn = &dfn;
  find.semi = &semi;
  eval.find = &find;
  uVar9 = (ulong)(uint)ndfn;
  find.inset = &inset;
  find.upset_minsemi = &upset_minsemi;
  eval.inset = &inset;
  eval.upset_minsemi = &upset_minsemi;
  while( true ) {
    peVar4 = local_140;
    if ((int)uVar9 < 2) {
      piVar3 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      *piVar3 = -1;
      for (lVar7 = 1; lVar7 < ndfn; lVar7 = lVar7 + 1) {
        iVar5 = seq.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar7];
        if (piVar3[iVar5] !=
            semi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar5]) {
          piVar3[iVar5] = piVar3[piVar3[iVar5]];
        }
      }
      this_01 = &local_140->doms;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::resize(this_01,(long)local_140->n_exprs);
      w = 1;
      while( true ) {
        if (peVar4->n_exprs <= w) break;
        piVar3 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (dfn.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[w] == -1) {
          piVar3[w] = -1;
        }
        else {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((this_01->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + piVar3[w],&w);
        }
        w = w + 1;
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&dom);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&upset_minsemi.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&inset.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&fa.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&semi.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&seq.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&dfn.super__Vector_base<int,_std::allocator<int>_>);
      return;
    }
    uVar9 = uVar9 - 1;
    w = seq.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [uVar9];
    pvVar1 = (local_140->e_in).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar2 = *(pointer *)
              ((long)&pvVar1[w].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data + 8);
    for (piVar8 = pvVar1[w].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start; piVar8 != piVar2; piVar8 = piVar8 + 1) {
      if (dfn.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [*piVar8] != -1) {
        iVar5 = compute_dominator_tree::anon_class_24_3_b8082bb5::operator()(&eval,*piVar8);
        if (dfn.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[semi.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar5]] <
            dfn.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[semi.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[w]]) {
          semi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[w] = semi.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar5];
        }
      }
    }
    lVar7 = (long)w;
    if (inset.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [lVar7] != w) break;
    inset.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [lVar7] = fa.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar7];
    std::vector<int,_std::allocator<int>_>::push_back
              (dom.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start +
               semi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[w],&w);
    piVar2 = dom.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start
             [fa.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[w]].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (piVar8 = dom.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start
                  [fa.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[w]].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start; piVar8 != piVar2; piVar8 = piVar8 + 1) {
      iVar5 = *piVar8;
      iVar6 = compute_dominator_tree::anon_class_24_3_b8082bb5::operator()(&eval,iVar5);
      if (dfn.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [semi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[iVar5]] <=
          dfn.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [semi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[iVar6]]) {
        iVar6 = fa.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[w];
      }
      (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[iVar5] = iVar6;
    }
    iVar5 = fa.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[w];
    piVar3 = dom.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar5].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if (dom.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[iVar5].
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
        piVar3) {
      dom.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar5].super__Vector_base<int,_std::allocator<int>_>
      ._M_impl.super__Vector_impl_data._M_finish = piVar3;
    }
  }
  __assert_fail("inset[w] == w",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gzz2000[P]Compiler101/ea_dominator_tree.cpp"
                ,0x25,
                "auto ee_dataflow::compute_dominator_tree()::(anonymous class)::operator()(int, int) const"
               );
}

Assistant:

void ee_dataflow::compute_dominator_tree() {
  int ndfn = 0;
  std::vector<int> dfn(n_exprs, -1), seq(n_exprs), semi(n_exprs), fa(n_exprs), inset(n_exprs), upset_minsemi(n_exprs);
  std::vector<std::vector<int>> dom(n_exprs);
  idom.resize(n_exprs);

  // compute dfs sequence
  const auto dfs_dfn = [&] (int u, auto &&dfs_dfn) -> void {
    dfn[u] = ndfn++;
    seq[dfn[u]] = u;
    for(int v: e_out[u]) if(dfn[v] == -1) {
        fa[v] = u;
        dfs_dfn(v, dfs_dfn);
      }
  };
  fa[0] = -1;
  dfs_dfn(0, dfs_dfn);

  // compute semi dominator
  for(int i = 0; i < n_exprs; ++i) {
    semi[i] = i;
    inset[i] = i;
    upset_minsemi[i] = i;
  }
  const auto link = [&] (int v, int w) {
    assert(inset[w] == w);
    inset[w] = v;
  };
  const auto find = [&] (int v, auto &&find) {
    if(inset[v] == v) return v;
    int p = find(inset[v], find);
    if(dfn[semi[upset_minsemi[p]]] < dfn[semi[upset_minsemi[v]]])
      upset_minsemi[v] = upset_minsemi[p];
    return inset[v] = p;
  };
  const auto eval = [&] (int v) {
    if(inset[v] == v) return v;
    else {
      find(v, find);
      return upset_minsemi[v];
    }
  };
  
  for(int i = ndfn - 1; i >= 1; --i) {
    int w = seq[i];
    for(int v: e_in[w]) {
      if(dfn[v] == -1) continue;
      int u = eval(v);
      if(dfn[semi[u]] < dfn[semi[w]]) semi[w] = semi[u];
    }
    link(fa[w], w);
    dom[semi[w]].push_back(w);
    for(int v: dom[fa[w]]) {
      int u = eval(v);
      idom[v] = (dfn[semi[u]] < dfn[semi[v]]) ? u : fa[w];
    }
    dom[fa[w]].clear();
  }

  // finalize immediate dominator
  idom[0] = -1;
  for(int i = 1; i < ndfn; ++i) {
    int w = seq[i];
    if(idom[w] != semi[w]) idom[w] = idom[idom[w]];
  }
  doms.resize(n_exprs);
  for(int i = 1; i < n_exprs; ++i) {
    if(dfn[i] == -1) idom[i] = -1;
    else doms[idom[i]].push_back(i);
  }
}